

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O2

void __thiscall
QDBusPlatformMenu::insertMenuItem
          (QDBusPlatformMenu *this,QPlatformMenuItem *menuItem,QPlatformMenuItem *before)

{
  QDBusPlatformMenu *vector;
  parameter_type pQVar1;
  qsizetype qVar2;
  QDebug *this_00;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QDBusPlatformMenuItem *beforeItem;
  QDBusPlatformMenuItem *item;
  QArrayDataPointer<char16_t> local_80;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined8 uStack_5c;
  undefined4 local_54;
  char *local_50;
  QDebug local_48;
  QDBusPlatformMenuItem *local_40;
  parameter_type local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  vector = this + 0x48;
  local_40 = (QDBusPlatformMenuItem *)before;
  local_38 = (parameter_type)menuItem;
  qVar2 = QtPrivate::indexOf<QDBusPlatformMenuItem*,QDBusPlatformMenuItem*>
                    ((QList<QDBusPlatformMenuItem_*> *)vector,&local_40,0);
  QtPrivateLogging::qLcMenu();
  if (((byte)QtPrivateLogging::qLcMenu::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
      1) != 0) {
    local_68 = 2;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = QtPrivateLogging::qLcMenu::category.name;
    QMessageLogger::debug();
    this_00 = QDebug::operator<<(&local_48,(int)*(short *)((long)&menuItem[2].m_tag + 2));
    local_80.d = *(Data **)(menuItem + 1);
    local_80.ptr = *(char16_t **)&menuItem[1].field_0x8;
    local_80.size = menuItem[1].m_tag;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QDebug::operator<<(this_00,(QString *)&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QDebug::~QDebug(&local_48);
  }
  pQVar1 = local_38;
  if ((int)(uint)qVar2 < 0) {
    QList<QDBusPlatformMenuItem_*>::append((QList<QDBusPlatformMenuItem_*> *)vector,local_38);
  }
  else {
    QList<QDBusPlatformMenuItem_*>::insert
              ((QList<QDBusPlatformMenuItem_*> *)vector,(ulong)((uint)qVar2 & 0x7fffffff),local_38);
  }
  uVar3 = (**(code **)(*(long *)&pQVar1->super_QPlatformMenuItem + 0x68))(pQVar1);
  local_68 = (undefined4)uVar3;
  uStack_64 = (undefined4)((ulong)uVar3 >> 0x20);
  QHash<unsigned_long_long,QDBusPlatformMenuItem*>::emplace<QDBusPlatformMenuItem*const&>
            ((QHash<unsigned_long_long,QDBusPlatformMenuItem*> *)(this + 0x40),
             (unsigned_long_long *)&local_68,&local_38);
  if ((QDBusPlatformMenu *)local_38->m_subMenu != (QDBusPlatformMenu *)0x0) {
    syncSubMenu(this,(QDBusPlatformMenu *)local_38->m_subMenu);
  }
  emitUpdated(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::insertMenuItem(QPlatformMenuItem *menuItem, QPlatformMenuItem *before)
{
    QDBusPlatformMenuItem *item = static_cast<QDBusPlatformMenuItem *>(menuItem);
    QDBusPlatformMenuItem *beforeItem = static_cast<QDBusPlatformMenuItem *>(before);
    int idx = m_items.indexOf(beforeItem);
    qCDebug(qLcMenu) << item->dbusID() << item->text();
    if (idx < 0)
        m_items.append(item);
    else
        m_items.insert(idx, item);
    m_itemsByTag.insert(item->tag(), item);
    if (item->menu())
        syncSubMenu(static_cast<const QDBusPlatformMenu *>(item->menu()));
    emitUpdated();
}